

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O0

void __thiscall
PersistentStorageJsonTestSuite_AddDomain_Test::TestBody
          (PersistentStorageJsonTestSuite_AddDomain_Test *this)

{
  Status SVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_3d8;
  AssertHelper local_3b8;
  Message local_3b0;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_370;
  Message local_368;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_328;
  Message local_320;
  allocator local_311;
  string local_310;
  DomainId local_2ec;
  Domain local_2e8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_240;
  Message local_238;
  allocator local_229;
  string local_228;
  DomainId local_204;
  Domain local_200;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_158;
  Message local_150;
  allocator local_141;
  string local_140;
  DomainId local_11c;
  Domain local_118;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_d0 [4];
  DomainId newId;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  PersistentStorageJson psj;
  PersistentStorageJsonTestSuite_AddDomain_Test *this_local;
  
  psj.mStorageLock.mPlatform = (sem_t *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"./tmp/test.tmp",&local_71);
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            ((PersistentStorageJson *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Open
                    ((PersistentStorageJson *)local_50);
  local_99 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)local_98,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)local_d0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  ot::commissioner::persistent_storage::DomainId::DomainId
            ((DomainId *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_11c,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"dom1",&local_141);
  ot::commissioner::persistent_storage::Domain::Domain(&local_118,&local_11c,&local_140);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    ((PersistentStorageJson *)local_50,&local_118,
                     (DomainId *)
                     ((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_e9 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  ot::commissioner::persistent_storage::Domain::~Domain(&local_118);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_e8,
               (AssertionResult *)
               "psj.Add(Domain{EMPTY_ID, \"dom1\"}, newId) == PersistentStorage::Status::kSuccess",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_189 = gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_188,&local_189,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar2) {
    testing::Message::Message(&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_188,
               (AssertionResult *)"newId.mId == 0","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_204,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"dom2",&local_229);
  ot::commissioner::persistent_storage::Domain::Domain(&local_200,&local_204,&local_228);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    ((PersistentStorageJson *)local_50,&local_200,
                     (DomainId *)
                     ((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_1d1 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  ot::commissioner::persistent_storage::Domain::~Domain(&local_200);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1d0,
               (AssertionResult *)
               "psj.Add(Domain{EMPTY_ID, \"dom2\"}, newId) == PersistentStorage::Status::kSuccess",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_271 = gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_270,&local_271,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar2) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_270,
               (AssertionResult *)"newId.mId == 1","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_2ec,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"dom3",&local_311);
  ot::commissioner::persistent_storage::Domain::Domain(&local_2e8,&local_2ec,&local_310);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    ((PersistentStorageJson *)local_50,&local_2e8,
                     (DomainId *)
                     ((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_2b9 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  ot::commissioner::persistent_storage::Domain::~Domain(&local_2e8);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar2) {
    testing::Message::Message(&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_2b8,
               (AssertionResult *)
               "psj.Add(Domain{EMPTY_ID, \"dom3\"}, newId) == PersistentStorage::Status::kSuccess",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_359 = gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar2) {
    testing::Message::Message(&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_358,
               (AssertionResult *)"newId.mId == 2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Close
                    ((PersistentStorageJson *)local_50);
  local_3a1 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar2) {
    testing::Message::Message(&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3d8,(internal *)local_3a0,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson
            ((PersistentStorageJson *)local_50);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, AddDomain)
{
    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    DomainId newId;

    EXPECT_TRUE(psj.Add(Domain{EMPTY_ID, "dom1"}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Domain{EMPTY_ID, "dom2"}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Domain{EMPTY_ID, "dom3"}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}